

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

int Fxch_ManDivSingleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  Vec_Int_t *pVVar1;
  int Lit;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int i;
  bool bVar8;
  int local_54;
  
  p = Vec_WecEntry(pFxchMan->vCubes,iCube);
  iVar2 = p->nSize;
  if (1 < iVar2) {
    local_54 = 1;
    while (local_54 < iVar2) {
      Lit = Vec_IntEntry(p,local_54);
      local_54 = local_54 + 1;
      for (i = local_54; iVar2 = p->nSize, i < iVar2; i = i + 1) {
        iVar2 = Vec_IntEntry(p,i);
        if (iVar2 <= Lit) {
          __assert_fail("Lit0 < Lit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchMan.c"
                        ,0x47,"int Fxch_ManDivSingleCube(Fxch_Man_t *, int, int, int)");
        }
        pVVar1 = pFxchMan->vCubeFree;
        pVVar1->nSize = 0;
        iVar3 = Abc_LitNot(Lit);
        uVar7 = 0;
        iVar3 = Abc_Var2Lit(iVar3,0);
        Vec_IntPush(pVVar1,iVar3);
        pVVar1 = pFxchMan->vCubeFree;
        iVar2 = Abc_LitNot(iVar2);
        iVar2 = Abc_Var2Lit(iVar2,1);
        Vec_IntPush(pVVar1,iVar2);
        piVar4 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * iCube);
        uVar5 = (ulong)(uint)pFxchMan->nSizeOutputID;
        if (pFxchMan->nSizeOutputID < 1) {
          uVar5 = uVar7;
        }
        iVar2 = 0;
        for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          uVar6 = ((uint)piVar4[uVar7] >> 1 & 0x55555555) + (piVar4[uVar7] & 0x55555555U);
          uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
          uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
          uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
          iVar2 = (uVar6 >> 0x10) + iVar2 + (uVar6 & 0xffff);
        }
        iVar2 = iVar2 + (uint)(iVar2 == 0);
        if (fAdd == 0) {
          while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
            Fxch_DivRemove(pFxchMan,fUpdate,1,0);
          }
          iVar2 = -1;
        }
        else {
          while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
            Fxch_DivAdd(pFxchMan,fUpdate,1,0);
          }
          iVar2 = 1;
        }
        pFxchMan->nPairsS = pFxchMan->nPairsS + iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

static inline int Fxch_ManDivSingleCube( Fxch_Man_t* pFxchMan,
                                         int iCube,
                                         int fAdd,
                                         int fUpdate )
{
    Vec_Int_t* vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int i, k,
        Lit0,
        Lit1,
        fSingleCube = 1,
        fBase = 0;

    if ( Vec_IntSize( vCube ) < 2 )
        return 0;

    Vec_IntForEachEntryStart( vCube, Lit0, i, 1)
    Vec_IntForEachEntryStart( vCube, Lit1, k, (i + 1) )
    {
        int * pOutputID, nOnes, j, z;
        assert( Lit0 < Lit1 );

        Vec_IntClear( pFxchMan->vCubeFree );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit0 ), 0 ) );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit1 ), 1 ) );

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            nOnes += Fxch_CountOnes( pOutputID[j] );

        if ( nOnes == 0 )
            nOnes = 1;

        if (fAdd)
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivAdd( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS++;
        }
        else
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivRemove( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS--;
        }
    }

    return Vec_IntSize( vCube ) * ( Vec_IntSize( vCube ) - 1 ) / 2;
}